

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gbmmap.c
# Opt level: O1

gbspace_t get_space(uint address)

{
  gbspace_t gVar1;
  
  gVar1 = rom_0;
  if ((((((0x3fff < address) && (gVar1 = rom_n, 0x7fff < address)) &&
        (gVar1 = vram, 0x9fff < address)) &&
       ((gVar1 = ram, 0xbfff < address && (gVar1 = wram_0, 0xcfff < address)))) &&
      ((gVar1 = wram_n, 0xdfff < address &&
       ((gVar1 = echo, 0xfdff < address && (gVar1 = oam, 0xfe9f < address)))))) &&
     ((gVar1 = unusable, 0xfeff < address && (gVar1 = io, 0xff7f < address)))) {
    gVar1 = hram;
    if (0xfffe < address) {
      gVar1 = (address != 0xffff) + ie;
    }
  }
  return gVar1;
}

Assistant:

gbspace_t get_space(unsigned address)
{
    if (address < 0x4000)
        return rom_0;
    if (address < 0x8000)
        return rom_n;
    if (address < 0xA000)
        return vram;
    if (address < 0xC000)
        return ram;
    if (address < 0xD000)
        return wram_0;
    if (address < 0xE000)
        return wram_n;
    if (address < 0xFE00)
        return echo;
    if (address < 0xFEA0)
        return oam;
    if (address < 0xFF00)
        return unusable;
    if (address < 0xFF80)
        return io;
    if (address < 0xFFFF)
        return hram;
    if (address == 0xFFFF)
        return ie;

    return out_of_mmap;
}